

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_149ae79::SSETest::SetUp(SSETest *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
  *p_Var2;
  __tuple_element_t<1UL,_tuple<FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
  *p_Var3;
  char *expr2;
  void *pvVar4;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int in_stack_ffffffffffffff6c;
  AssertHelper *in_stack_ffffffffffffff70;
  uchar **in_stack_ffffffffffffff78;
  int line;
  char *in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertHelper *this_01;
  AssertionResult local_58;
  uint local_44;
  undefined8 local_20;
  Message *in_stack_ffffffffffffffe8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffff0;
  
  testing::
  WithParamInterface<std::tuple<libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
  ::GetParam();
  p_Var2 = std::
           get<0ul,libaom_test::FuncParam<long(*)(unsigned_char_const*,int,unsigned_char_const*,int,int,int)>,int>
                     ((tuple<libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>
                       *)0xc6f559);
  *(_func_long_uchar_ptr_int_uchar_ptr_int_int_int **)(in_RDI + 0x20) = p_Var2->ref_func;
  *(_func_long_uchar_ptr_int_uchar_ptr_int_int_int **)(in_RDI + 0x28) = p_Var2->tst_func;
  *(int *)(in_RDI + 0x30) = p_Var2->bit_depth;
  testing::
  WithParamInterface<std::tuple<libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
  ::GetParam();
  p_Var3 = std::
           get<1ul,libaom_test::FuncParam<long(*)(unsigned_char_const*,int,unsigned_char_const*,int,int,int)>,int>
                     ((tuple<libaom_test::FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>
                       *)0xc6f583);
  *(__tuple_element_t<1UL,_tuple<FuncParam<long_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_int>_>
    *)(in_RDI + 0x1c) = *p_Var3;
  in_RDI[0x18] = *(code **)(in_RDI + 0x20) == aom_highbd_sse_c;
  expr2 = in_RDI + 0x48;
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::Reset((ACMRandom *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  pvVar4 = aom_memalign((size_t)in_RDI,(size_t)expr2);
  *(void **)(in_RDI + 0x38) = pvVar4;
  pvVar4 = aom_memalign((size_t)in_RDI,(size_t)expr2);
  *(void **)(in_RDI + 0x40) = pvVar4;
  local_20 = 0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            (in_RDI,expr2,in_stack_ffffffffffffff78,&in_stack_ffffffffffffff70->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff78 =
         (uchar **)testing::AssertionResult::failure_message((AssertionResult *)0xc6f64f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
               (int)((ulong)in_RDI >> 0x20),expr2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffff0._M_head_impl,in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff70);
    testing::Message::~Message((Message *)0xc6f69d);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc6f703);
  if (local_44 == 0) {
    this_01 = (AssertHelper *)0x0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              (in_RDI,expr2,in_stack_ffffffffffffff78,&in_stack_ffffffffffffff70->data_);
    line = (int)((ulong)in_RDI >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0xc6f77e);
      testing::internal::AssertHelper::AssertHelper
                (this_01,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,line,expr2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffff0._M_head_impl,in_stack_ffffffffffffffe8);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0xc6f7cc);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xc6f82c);
  }
  return;
}

Assistant:

void SetUp() override {
    params_ = GET_PARAM(0);
    width_ = GET_PARAM(1);
    is_hbd_ =
#if CONFIG_AV1_HIGHBITDEPTH
        params_.ref_func == aom_highbd_sse_c;
#else
        false;
#endif
    rnd_.Reset(ACMRandom::DeterministicSeed());
    src_ = reinterpret_cast<uint8_t *>(aom_memalign(32, 256 * 256 * 2));
    ref_ = reinterpret_cast<uint8_t *>(aom_memalign(32, 256 * 256 * 2));
    ASSERT_NE(src_, nullptr);
    ASSERT_NE(ref_, nullptr);
  }